

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall
Omega_h::clamp_metrics(Omega_h *this,LO nmetrics,Reals *metrics,Real h_min,Real h_max)

{
  Int IVar1;
  void *extraout_RDX;
  Write<double> *this_00;
  Reals RVar2;
  Write<double> local_68;
  Write<double> local_58;
  Write<double> local_48;
  Write<double> local_38;
  
  Write<double>::Write(&local_38,&metrics->write_);
  IVar1 = get_metrics_dim(nmetrics,(Reals *)&local_38);
  Write<double>::~Write(&local_38);
  if (IVar1 == 1) {
    this_00 = &local_68;
    Write<double>::Write(this_00,&metrics->write_);
    clamp_metrics_dim<1>(this,nmetrics,(Reals *)this_00,h_min,h_max);
  }
  else if (IVar1 == 2) {
    this_00 = &local_58;
    Write<double>::Write(this_00,&metrics->write_);
    clamp_metrics_dim<2>(this,nmetrics,(Reals *)this_00,h_min,h_max);
  }
  else {
    if (IVar1 != 3) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
           ,0x35);
    }
    this_00 = &local_48;
    Write<double>::Write(this_00,&metrics->write_);
    clamp_metrics_dim<3>(this,nmetrics,(Reals *)this_00,h_min,h_max);
  }
  Write<double>::~Write(this_00);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals clamp_metrics(LO nmetrics, Reals metrics, Real h_min, Real h_max) {
  auto dim = get_metrics_dim(nmetrics, metrics);
  if (dim == 3) return clamp_metrics_dim<3>(nmetrics, metrics, h_min, h_max);
  if (dim == 2) return clamp_metrics_dim<2>(nmetrics, metrics, h_min, h_max);
  if (dim == 1) return clamp_metrics_dim<1>(nmetrics, metrics, h_min, h_max);
  OMEGA_H_NORETURN(Reals());
}